

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StandardColumnData::GetUpdateStatistics(StandardColumnData *this)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer this_00;
  type other;
  long in_RSI;
  undefined1 local_98 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  LogicalType local_80;
  BaseStatistics local_68;
  
  if (*(long *)(in_RSI + 0xc0) == 0) {
    local_98._0_8_ = (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0;
  }
  else {
    unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::operator->
              ((unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>
                *)(in_RSI + 0xc0));
    UpdateSegment::GetStatistics((UpdateSegment *)local_98);
  }
  ColumnData::GetUpdateStatistics((ColumnData *)(local_98 + 8));
  if ((ColumnData *)local_98._0_8_ == (ColumnData *)0x0) {
    if ((BaseStatistics *)local_98._8_8_ == (BaseStatistics *)0x0) {
      (this->super_ColumnData)._vptr_ColumnData = (_func_int **)0x0;
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
    LogicalType::LogicalType(&local_80,(LogicalType *)(in_RSI + 0x30));
    BaseStatistics::CreateEmpty(&local_68,&local_80);
    BaseStatistics::ToUnique((BaseStatistics *)&local_88);
    _Var2._M_pi = local_88._M_pi;
    uVar1 = local_98._0_8_;
    local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._0_8_ = _Var2._M_pi;
    if ((tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)uVar1 !=
        (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
      BaseStatistics::~BaseStatistics((BaseStatistics *)uVar1);
      operator_delete((void *)uVar1);
      _Var2._M_pi = local_88._M_pi;
      if ((BaseStatistics *)local_88._M_pi != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_88._M_pi);
        operator_delete(_Var2._M_pi);
      }
    }
    local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    BaseStatistics::~BaseStatistics(&local_68);
    LogicalType::~LogicalType(&local_80);
  }
  if ((BaseStatistics *)local_98._8_8_ == (BaseStatistics *)0x0) {
    (this->super_ColumnData)._vptr_ColumnData = (_func_int **)local_98._0_8_;
  }
  else {
    this_00 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                            *)local_98);
    other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       *)(local_98 + 8));
    BaseStatistics::Merge(this_00,other);
    (this->super_ColumnData)._vptr_ColumnData = (_func_int **)local_98._0_8_;
    local_98._0_8_ =
         (tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)0x0;
    if ((BaseStatistics *)local_98._8_8_ != (BaseStatistics *)0x0) {
      BaseStatistics::~BaseStatistics((BaseStatistics *)local_98._8_8_);
      operator_delete((void *)local_98._8_8_);
      uVar1 = local_98._0_8_;
      if ((_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)local_98._0_8_ !=
          (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_98._0_8_);
        operator_delete((void *)uVar1);
      }
    }
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StandardColumnData::GetUpdateStatistics() {
	auto stats = updates ? updates->GetStatistics() : nullptr;
	auto validity_stats = validity.GetUpdateStatistics();
	if (!stats && !validity_stats) {
		return nullptr;
	}
	if (!stats) {
		stats = BaseStatistics::CreateEmpty(type).ToUnique();
	}
	if (validity_stats) {
		stats->Merge(*validity_stats);
	}
	return stats;
}